

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTHumidityHTU21D.cpp
# Opt level: O3

bool __thiscall RTHumidityHTU21D::processBackground(RTHumidityHTU21D *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  undefined8 in_RAX;
  uint64_t uVar5;
  int iVar6;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  uVar5 = RTMath::currentUSecsSinceEpoch();
  if (uVar5 - this->m_startTime < 100000) {
    return true;
  }
  iVar6 = 1;
  switch(this->m_state) {
  case 0:
    break;
  case 1:
    bVar3 = RTIMUHal::HALWrite(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                               this->m_humidityAddr,0xf3,'\0',(uchar *)0x0,
                               "Failed to start HTU21D temp conv");
    iVar6 = 2;
    goto LAB_0011f52f;
  case 2:
    iVar6 = 3;
    bVar3 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                              this->m_humidityAddr,'\x03',(uchar *)((long)&uStack_28 + 5),
                              "Failed to read HTU21D temperature");
    uVar1 = uStack_28;
    if (!bVar3) {
      return false;
    }
    uVar4 = (uint)uStack_28._6_1_;
    uStack_28._0_7_ = CONCAT16((char)(uVar4 & 0xfffffffc),(undefined6)uStack_28);
    uVar2 = uStack_28;
    uStack_28._5_1_ = SUB81(uVar1,5);
    this->m_temperature =
         (float)((uint)uStack_28._5_1_ << 8 | uVar4 & 0xfffffffc) * 175.72 * 1.5258789e-05 + -46.85;
    this->m_temperatureValid = true;
    uStack_28 = uVar2;
    bVar3 = RTIMUHal::HALWrite(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                               this->m_humidityAddr,0xf5,'\0',(uchar *)0x0,
                               "Failed to start HTU21D humidity conv");
LAB_0011f52f:
    if (bVar3 == false) {
      return false;
    }
    break;
  case 3:
    bVar3 = RTIMUHal::HALRead(&((this->super_RTHumidity).m_settings)->super_RTIMUHal,
                              this->m_humidityAddr,'\x03',(uchar *)((long)&uStack_28 + 5),
                              "Failed to read HTU21D humidity");
    if (!bVar3) {
      return false;
    }
    this->m_humidity =
         (25.0 - this->m_temperature) * -0.15 +
         (float)(((uint)uStack_28._5_1_ << 8 | uStack_28._6_1_ & 0xfffffffc) * 0x7d) * 1.5258789e-05
         + -6.0;
    this->m_humidityValid = true;
    break;
  default:
    goto switchD_0011f477_default;
  }
  this->m_state = iVar6;
  this->m_startTime = uVar5;
switchD_0011f477_default:
  return true;
}

Assistant:

bool RTHumidityHTU21D:: processBackground()
{
    unsigned char rawData[3];
    uint64_t now = RTMath::currentUSecsSinceEpoch();
    bool expired = (now - m_startTime) >= HTU21D_STATE_INTERVAL;

    if (!expired)
        return true;

    switch (m_state) {
    case HTU21D_STATE_IN_RESET:
        m_state = HTU21D_STATE_IDLE;
        m_startTime = now;
        break;

    case HTU21D_STATE_IDLE:
        // start a temperature conversion
        if (!m_settings->HALWrite(m_humidityAddr, HTU21D_CMD_TRIG_TEMP, 0, NULL, "Failed to start HTU21D temp conv"))
            return false;
        m_state = HTU21D_STATE_TEMP_REQ;
        m_startTime = now;
        break;

    case HTU21D_STATE_TEMP_REQ:
        // read temp data
        if (!m_settings->HALRead(m_humidityAddr, 3, rawData, "Failed to read HTU21D temperature"))
            return false;
        // remove status bits
        rawData[1] &= 0xfc;
        m_temperature = -46.85 + 175.72 * (RTFLOAT)((((uint16_t)rawData[0]) << 8) | (uint16_t)rawData[1]) / 65536.0;
        m_temperatureValid = true;

        // start humidity conversion
        if (!m_settings->HALWrite(m_humidityAddr, HTU21D_CMD_TRIG_HUM, 0, NULL, "Failed to start HTU21D humidity conv"))
            return false;
        m_state = HTU21D_STATE_HUM_REQ;
        m_startTime = now;
        break;

    case HTU21D_STATE_HUM_REQ:
        // read humidity data
        if (!m_settings->HALRead(m_humidityAddr, 3, rawData, "Failed to read HTU21D humidity"))
            return false;
        // remove status bits
        rawData[1] &= 0xfc;
        m_humidity = -6.0 + 125.0 * (RTFLOAT)((((uint16_t)rawData[0]) << 8) | (uint16_t)rawData[1]) / 65536.0;
        // do temp compensation
        m_humidity += (25.0 - m_temperature) * -0.15;
        m_humidityValid = true;
        m_state = HTU21D_STATE_IDLE;
        m_startTime = now;
        break;
    }
    return true;
}